

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::pipeline::multisample::
MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtCentroidConsistency>::createInstance
          (MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtCentroidConsistency> *this,
          Context *context)

{
  TestInstance *this_00;
  Context *context_local;
  MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtCentroidConsistency> *this_local;
  
  this_00 = (TestInstance *)operator_new(0x30);
  MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateScreenPosition>::MSInstance
            ((MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateScreenPosition> *)this_00,
             context,&(this->super_MultisampleCaseBase).m_imageMSParams);
  return this_00;
}

Assistant:

TestInstance* MSCase<MSCaseInterpolateAtCentroidConsistency>::createInstance (Context& context) const
{
	return new MSInstance<MSInstanceInterpolateScreenPosition>(context, m_imageMSParams);
}